

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O0

DecodePsbtUtxoStruct * __thiscall
cfd::api::json::DecodePsbtUtxo::ConvertToStruct(DecodePsbtUtxo *this)

{
  long in_RSI;
  DecodePsbtUtxoStruct *in_RDI;
  DecodePsbtUtxoStruct *result;
  DecodePsbtLockingScriptStruct *pDVar1;
  DecodePsbtUtxoStruct *this_00;
  DecodePsbtLockingScript *in_stack_ffffffffffffff38;
  
  this_00 = in_RDI;
  DecodePsbtUtxoStruct::DecodePsbtUtxoStruct(in_RDI);
  in_RDI->amount = *(int64_t *)(in_RSI + 0x38);
  DecodePsbtLockingScript::ConvertToStruct(in_stack_ffffffffffffff38);
  pDVar1 = (DecodePsbtLockingScriptStruct *)&stack0xffffffffffffff38;
  DecodePsbtLockingScriptStruct::operator=((DecodePsbtLockingScriptStruct *)this_00,pDVar1);
  DecodePsbtLockingScriptStruct::~DecodePsbtLockingScriptStruct
            ((DecodePsbtLockingScriptStruct *)this_00);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this_00,
              (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)pDVar1);
  return this_00;
}

Assistant:

DecodePsbtUtxoStruct DecodePsbtUtxo::ConvertToStruct() const {  // NOLINT
  DecodePsbtUtxoStruct result;
  result.amount = amount_;
  result.script_pub_key = script_pub_key_.ConvertToStruct();
  result.ignore_items = ignore_items;
  return result;
}